

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

int __thiscall banksia::ChessBoard::toPieceCount(ChessBoard *this,int *pieceCnt)

{
  pointer pPVar1;
  pointer pPVar2;
  Piece PVar3;
  int iVar4;
  long lVar5;
  PieceType PVar6;
  
  if (pieceCnt != (int *)0x0) {
    pieceCnt[8] = 0;
    pieceCnt[9] = 0;
    pieceCnt[10] = 0;
    pieceCnt[0xb] = 0;
    pieceCnt[4] = 0;
    pieceCnt[5] = 0;
    pieceCnt[6] = 0;
    pieceCnt[7] = 0;
    pieceCnt[0] = 0;
    pieceCnt[1] = 0;
    pieceCnt[2] = 0;
    pieceCnt[3] = 0;
    pieceCnt[0xc] = 0;
    pieceCnt[0xd] = 0;
  }
  pPVar1 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = 0;
  iVar4 = 0;
  do {
    if ((long)pPVar2 - (long)pPVar1 >> 3 == lVar5) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",lVar5);
    }
    PVar3 = pPVar1[lVar5];
    PVar6 = PVar3.type;
    if (PVar6 != empty) {
      iVar4 = iVar4 + 1;
      if (pieceCnt != (int *)0x0) {
        pieceCnt[(int)(PVar6 + PVar3.side * 7)] = pieceCnt[(int)(PVar6 + PVar3.side * 7)] + 1;
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x40);
  return iVar4;
}

Assistant:

int ChessBoard::toPieceCount(int* pieceCnt) const
{
    if (pieceCnt) {
        memset(pieceCnt, 0, 14 * sizeof(int));
    }
    auto totalCnt = 0;;
    for(int i = 0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) continue;
        totalCnt++;
        auto sd = static_cast<int>(piece.side), type = static_cast<int>(piece.type);
        if (pieceCnt) {
            pieceCnt[sd * 7 + type]++;
        }
    }

    assert(totalCnt >= 2 && totalCnt <= 32);
    return totalCnt;
}